

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertBits(UNITY_INT mask,UNITY_INT expected,UNITY_INT actual,char *msg,
                    UNITY_UINT lineNumber)

{
  if ((Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) &&
     (((actual ^ expected) & mask) != 0)) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintMask(mask,expected);
    UnityPrint(" Was ");
    UnityPrintMask(mask,actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityAssertBits(const UNITY_INT mask,
                     const UNITY_INT expected,
                     const UNITY_INT actual,
                     const char* msg,
                     const UNITY_LINE_TYPE lineNumber)
{
    RETURN_IF_FAIL_OR_IGNORE;

    if ((mask & expected) != (mask & actual))
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintMask((UNITY_UINT)mask, (UNITY_UINT)expected);
        UnityPrint(UnityStrWas);
        UnityPrintMask((UNITY_UINT)mask, (UNITY_UINT)actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}